

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_heat_maps_test.cpp
# Opt level: O2

void __thiscall check_vectorize_for_heat_maps::test_method(check_vectorize_for_heat_maps *this)

{
  long lVar1;
  vector<double,_std::allocator<double>_> p_vect_template;
  undefined **local_188;
  undefined1 local_180;
  undefined8 *local_178;
  char **local_170;
  vector<double,_std::allocator<double>_> p_vect;
  undefined1 local_150 [8];
  undefined8 local_148;
  shared_count sStack_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> p;
  
  Gudhi::Persistence_representations::create_Gaussian_filter(&filter,0x1e,1.0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_f8,&filter);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  Persistence_heat_maps(&p,"data/file_with_diagram",&local_f8,false,5,0.0,1.0,0xffffffff);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_f8);
  p_vect_template.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_vect_template.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  p_vect_template.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188 = (undefined **)0x3faf108157837494;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faf3bb186f628e7;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faf20e3a556663e;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faec0cce449c114;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fae1df8388b61c8;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fafbc3900d28dd7;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fafe8a499a7dc52;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fafcd90412b437b;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faf6bb48400ab21;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faec5a30cdfe253;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb0118e9dbd14c9;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb0283324f07a51;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb01aa59db3da8d;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fafd27de6b5ac1f;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faf2a9a077da2c3;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb0213f14e8c551;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb0382001fe0701;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb02aaba534d84f;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faff2792ec006ec;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faf4a3ab6b53353;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb00cc28621ed91;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb023af31b152f4;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fb01672324c8366;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3fafcacc418c924a;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  local_188 = (undefined **)0x3faf23aafff36ac6;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&p_vect_template,(double *)&local_188);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::vectorize
            (&p_vect,&p,0);
  for (lVar1 = 0;
      lVar1 != (long)p_vect.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)p_vect.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3; lVar1 = lVar1 + 1) {
    local_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x7b,&local_118);
    local_150[0] = ABS(p_vect_template.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar1] -
                       p_vect.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar1]) <
                   Gudhi::Persistence_representations::epsi;
    local_148 = 0;
    sStack_140.pi_ = (sp_counted_base *)0x0;
    local_128 = "almost_equal(p_vect_template[i], p_vect[i])";
    local_120 = "";
    local_180 = 0;
    local_188 = &PTR__lazy_ostream_00111d48;
    local_178 = &boost::unit_test::lazy_ostream::inst;
    local_170 = &local_128;
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_heat_maps_test.cpp"
    ;
    local_130 = "";
    boost::test_tools::tt_detail::report_assertion(local_150,&local_188,&local_138,0x7b,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_140);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&p_vect.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&p_vect_template.super__Vector_base<double,_std::allocator<double>_>);
  Gudhi::Persistence_representations::
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
  ~Persistence_heat_maps(&p);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&filter);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_vectorize_for_heat_maps) {
  std::vector<std::vector<double> > filter = create_Gaussian_filter(30, 1);
  Persistence_heat_maps<constant_scaling_function> p("data/file_with_diagram", filter, false, 5, 0, 1);

  std::vector<double> p_vect_template;

  p_vect_template.push_back(0.0606728);
  p_vect_template.push_back(0.0610023);
  p_vect_template.push_back(0.0607978);
  p_vect_template.push_back(0.0600647);
  p_vect_template.push_back(0.0588224);
  p_vect_template.push_back(0.0619829);
  p_vect_template.push_back(0.0623218);
  p_vect_template.push_back(0.0621152);
  p_vect_template.push_back(0.0613686);
  p_vect_template.push_back(0.0601016);
  p_vect_template.push_back(0.0627679);
  p_vect_template.push_back(0.0631134);
  p_vect_template.push_back(0.0629066);
  p_vect_template.push_back(0.0621528);
  p_vect_template.push_back(0.0608719);
  p_vect_template.push_back(0.0630073);
  p_vect_template.push_back(0.0633564);
  p_vect_template.push_back(0.0631511);
  p_vect_template.push_back(0.0623968);
  p_vect_template.push_back(0.0611132);
  p_vect_template.push_back(0.0626947);
  p_vect_template.push_back(0.0630445);
  p_vect_template.push_back(0.0628425);
  p_vect_template.push_back(0.0620941);
  p_vect_template.push_back(0.060819);

  std::vector<double> p_vect = p.vectorize(0);
  for (size_t i = 0; i != p_vect.size(); ++i) {
    BOOST_CHECK(almost_equal(p_vect_template[i], p_vect[i]));
  }
}